

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridGlobal.cpp
# Opt level: O0

void __thiscall
TasGrid::GridGlobal::loadConstructedPoint(GridGlobal *this,double *x,int numx,double *y)

{
  int iVar1;
  AddPointResult AVar2;
  double *pdVar3;
  pointer pDVar4;
  double *pdVar5;
  int *tensor;
  pointer this_00;
  double dVar6;
  anon_class_8_1_8991fb9c local_d0;
  function<int_(int)> local_c8;
  vector<int,_std::allocator<int>_> local_a8;
  allocator<double> local_89;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> idx;
  int i;
  undefined1 local_48 [8];
  Wrapper2D<const_double> wrapy;
  Wrapper2D<const_double> wrapx;
  double *y_local;
  int numx_local;
  double *x_local;
  GridGlobal *this_local;
  
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)&wrapy.data,(this->super_BaseCanonicalGrid).num_dimensions,x
            );
  Utils::Wrapper2D<const_double>::Wrapper2D
            ((Wrapper2D<const_double> *)local_48,(this->super_BaseCanonicalGrid).num_outputs,y);
  for (idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < numx;
      idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage + 1) {
    pdVar3 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)&wrapy.data,
                        (int)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    getMultiIndex((vector<int,_std::allocator<int>_> *)local_70,this,pdVar3);
    pDVar4 = ::std::
             unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
             ::operator->(&this->dynamic_values);
    pdVar3 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)local_48,
                        (int)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    pdVar5 = Utils::Wrapper2D<const_double>::getStrip
                       ((Wrapper2D<const_double> *)local_48,
                        (int)idx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
    iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    ::std::allocator<double>::allocator(&local_89);
    ::std::vector<double,std::allocator<double>>::vector<double_const*,void>
              ((vector<double,std::allocator<double>> *)&local_88,pdVar3,pdVar5 + iVar1,&local_89);
    AVar2 = DynamicConstructorDataGlobal::addNewNode
                      (pDVar4,(vector<int,_std::allocator<int>_> *)local_70,&local_88);
    ::std::vector<double,_std::allocator<double>_>::~vector(&local_88);
    ::std::allocator<double>::~allocator(&local_89);
    if (AVar2 == tensor_missing) {
      pDVar4 = ::std::
               unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
               ::operator->(&this->dynamic_values);
      OneDimensionalWrapper::getLevels
                (&local_a8,&this->wrapper,(vector<int,_std::allocator<int>_> *)local_70);
      tensor = ::std::vector<int,_std::allocator<int>_>::data(&local_a8);
      local_d0.this = this;
      ::std::function<int(int)>::
      function<TasGrid::GridGlobal::loadConstructedPoint(double_const*,int,double_const*)::__0,void>
                ((function<int(int)> *)&local_c8,&local_d0);
      this_00 = ::std::
                unique_ptr<TasGrid::DynamicConstructorDataGlobal,_std::default_delete<TasGrid::DynamicConstructorDataGlobal>_>
                ::operator->(&this->dynamic_values);
      dVar6 = DynamicConstructorDataGlobal::getMaxTensorWeight(this_00);
      DynamicConstructorDataGlobal::addTensor(pDVar4,tensor,&local_c8,dVar6 + 1.0);
      ::std::function<int_(int)>::~function(&local_c8);
      ::std::vector<int,_std::allocator<int>_>::~vector(&local_a8);
    }
    ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70)
    ;
  }
  loadConstructedTensors(this);
  Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)local_48);
  Utils::Wrapper2D<const_double>::~Wrapper2D((Wrapper2D<const_double> *)&wrapy.data);
  return;
}

Assistant:

void GridGlobal::loadConstructedPoint(const double x[], int numx, const double y[]){
    Utils::Wrapper2D<const double> wrapx(num_dimensions, x);
    Utils::Wrapper2D<const double> wrapy(num_outputs, y);
    for(int i=0; i<numx; i++){
        std::vector<int> idx = getMultiIndex(wrapx.getStrip(i));
        if (dynamic_values->addNewNode(idx, std::vector<double>(wrapy.getStrip(i), wrapy.getStrip(i) + num_outputs))
            == DynamicConstructorDataGlobal::AddPointResult::tensor_missing){
            dynamic_values->addTensor(wrapper.getLevels(idx).data(), [&](int l)->int{ return wrapper.getNumPoints(l); },
                                      dynamic_values->getMaxTensorWeight() + 1.0);
        }
    }
    loadConstructedTensors();
}